

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall DACSThinker::StopScriptsFor(DACSThinker *this,AActor *actor)

{
  DLevelScript *pDVar1;
  AActor *pAVar2;
  
  for (pDVar1 = this->Scripts; pDVar1 != (DLevelScript *)0x0; pDVar1 = pDVar1->next) {
    pAVar2 = (pDVar1->activator).field_0.p;
    if ((pAVar2 != (AActor *)0x0) &&
       (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (pDVar1->activator).field_0.p = (AActor *)0x0;
      pAVar2 = (AActor *)0x0;
    }
    if (pAVar2 == actor) {
      pDVar1->state = SCRIPT_PleaseRemove;
    }
  }
  return;
}

Assistant:

void DACSThinker::StopScriptsFor (AActor *actor)
{
	DLevelScript *script = Scripts;

	while (script != NULL)
	{
		DLevelScript *next = script->next;
		if (script->activator == actor)
		{
			script->SetState (DLevelScript::SCRIPT_PleaseRemove);
		}
		script = next;
	}
}